

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermediate_code.cpp
# Opt level: O2

ExprNode * __thiscall InFrame::accessCode(InFrame *this)

{
  int iVar1;
  Temp *pTVar2;
  ExprNode *pEVar3;
  _func_int **pp_Var4;
  _func_int *p_Var5;
  _func_int *p_Var6;
  
  pEVar3 = (ExprNode *)operator_new(0x18);
  pp_Var4 = (_func_int **)operator_new(0x20);
  p_Var5 = (_func_int *)operator_new(0x18);
  pTVar2 = FP;
  *(undefined ***)p_Var5 = &PTR__TEMP_00124440;
  *(Temp **)(p_Var5 + 0x10) = pTVar2;
  *(undefined4 *)(p_Var5 + 8) = 3;
  p_Var6 = (_func_int *)operator_new(0x10);
  iVar1 = this->offset;
  *(undefined ***)p_Var6 = &PTR__ICTNode_00124a90;
  *(int *)(p_Var6 + 0xc) = iVar1;
  *(undefined4 *)(p_Var6 + 8) = 0;
  *pp_Var4 = (_func_int *)&PTR__BINOP_00124490;
  pp_Var4[2] = p_Var5;
  pp_Var4[3] = p_Var6;
  pp_Var4[1] = (_func_int *)0x2c00000004;
  (pEVar3->super_StmNode).super_ICTNode._vptr_ICTNode = (_func_int **)&PTR__MEM_001244e0;
  pEVar3[1].super_StmNode.super_ICTNode._vptr_ICTNode = pp_Var4;
  (pEVar3->super_StmNode).typeStm = 5;
  return pEVar3;
}

Assistant:

ExprNode *InFrame::accessCode() {
    return new MEM(new BINOP(PLUS, new TEMP(FP), new CONST(this->getOffset())));
}